

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_notifier.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::anon_unknown_2::ip_change_notifier_impl::ip_change_notifier_impl
          (ip_change_notifier_impl *this,io_context *ios)

{
  io_context *context;
  no_enobufs local_54;
  undefined1 local_50 [8];
  error_code ec;
  protocol_type local_2c;
  basic_nl_endpoint<libtorrent::aux::netlink> local_28;
  io_context *local_18;
  io_context *ios_local;
  ip_change_notifier_impl *this_local;
  
  local_18 = ios;
  ios_local = (io_context *)this;
  ip_change_notifier::ip_change_notifier(&this->super_ip_change_notifier);
  context = local_18;
  (this->super_ip_change_notifier)._vptr_ip_change_notifier = (_func_int **)&PTR_async_wait_00b8dca0
  ;
  netlink::netlink(&local_2c,0);
  basic_nl_endpoint<libtorrent::aux::netlink>::basic_nl_endpoint(&local_28,local_2c,0x110,0);
  boost::asio::
  basic_raw_socket<libtorrent::aux::netlink,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_raw_socket<boost::asio::io_context>(&this->m_socket,context,&local_28,(type *)0x0);
  ::std::
  unordered_map<unsigned_int,_libtorrent::aux::(anonymous_namespace)::ip_change_notifier_impl::local_address,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::aux::(anonymous_namespace)::ip_change_notifier_impl::local_address>_>_>
  ::unordered_map(&this->m_state);
  boost::system::error_code::error_code((error_code *)local_50);
  no_enobufs::no_enobufs(&local_54,true);
  boost::asio::
  basic_socket<libtorrent::aux::netlink,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::set_option<libtorrent::no_enobufs>
            (&(this->m_socket).
              super_basic_socket<libtorrent::aux::netlink,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             ,&local_54,(error_code *)local_50);
  return;
}

Assistant:

explicit ip_change_notifier_impl(io_context& ios)
		: m_socket(ios
			, netlink::endpoint(netlink(NETLINK_ROUTE), RTMGRP_IPV4_IFADDR | RTMGRP_IPV6_IFADDR))
	{
		// Linux can generate ENOBUFS if the socket's buffers are full
		// don't treat it as an error
		error_code ec;
		m_socket.set_option(libtorrent::no_enobufs(true), ec);
	}